

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::write_char(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
             *this,char_type value)

{
  type pwVar1;
  
  if (this->specs_ != (format_specs *)0x0) {
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
    ::
    write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>::char_writer>
              ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
                *)this,&this->specs_->super_align_spec,(char_writer *)&stack0xfffffffffffffffc);
    return;
  }
  pwVar1 = reserve<fmt::v5::internal::basic_buffer<wchar_t>>
                     ((back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_> *)this,1);
  *pwVar1 = value;
  return;
}

Assistant:

void write_char(char_type value) {
    if (specs_)
      writer_.write_padded(*specs_, char_writer{value});
    else
      writer_.write(value);
  }